

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O0

int __thiscall qclab::io::QASMFile::parseQubit(QASMFile *this,string *str)

{
  int iVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  string *local_18;
  string *str_local;
  QASMFile *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"]",&local_59);
  left_of(&local_38,str,&local_58);
  iVar1 = read_value<int>(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return iVar1;
}

Assistant:

int parseQubit( std::string& str ) const {
        return read_value< int >( left_of( str , "]" ) ) ;
      }